

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

Filter * __thiscall helics::Federate::getFilter(Federate *this,string_view filterName)

{
  string_view addition;
  string_view name;
  string_view name_00;
  bool bVar1;
  Filter *pFVar2;
  pointer this_00;
  ConnectorFederateManager *in_RDX;
  Federate *in_RSI;
  char *unaff_retaddr;
  Filter *filt;
  char *in_stack_ffffffffffffff98;
  size_t in_stack_fffffffffffffff8;
  
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::operator->((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                *)0x3549e5);
  name._M_str = unaff_retaddr;
  name._M_len = in_stack_fffffffffffffff8;
  pFVar2 = ConnectorFederateManager::getFilter(in_RDX,name);
  bVar1 = Interface::isValid((Interface *)0x354a26);
  if (!bVar1) {
    this_00 = std::
              unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
              ::operator->((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                            *)0x354a3c);
    addition._M_str = in_stack_ffffffffffffff98;
    addition._M_len = (size_t)in_RDX;
    localNameGenerator_abi_cxx11_(in_RSI,addition);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    name_00._M_str = unaff_retaddr;
    name_00._M_len = in_stack_fffffffffffffff8;
    pFVar2 = ConnectorFederateManager::getFilter(in_RDX,name_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  return pFVar2;
}

Assistant:

const Filter& Federate::getFilter(std::string_view filterName) const
{
    const Filter& filt = cManager->getFilter(filterName);
    if (!filt.isValid()) {
        return cManager->getFilter(localNameGenerator(filterName));
    }
    return filt;
}